

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
ast::CallExpression::toString_abi_cxx11_(string *__return_storage_ptr__,CallExpression *this)

{
  pointer ppEVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  ostringstream msg;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  operator<<((ostream *)local_1a0,this->function);
  std::operator<<((ostream *)local_1a0,"(");
  for (lVar3 = 0;
      ppEVar1 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(this->arguments).
                                  super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3);
      lVar3 = lVar3 + 1) {
    if (lVar3 != 0) {
      std::operator<<((ostream *)local_1a0,", ");
      ppEVar1 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    operator<<((ostream *)local_1a0,ppEVar1[lVar3]);
  }
  poVar2 = std::operator<<((ostream *)local_1a0,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::CallExpression::toString() const
{
    std::ostringstream msg;
    msg << function;
    msg << "(";
    for(int i{0}; i < (int)arguments.size(); i++){
        if(i > 0 && i+1 <= (int)arguments.size()){
            msg << ", ";
        }
        msg << arguments[i];
    }
    msg << ")" << std::endl;
    return msg.str();
}